

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idastar.hpp
# Opt level: O3

bool __thiscall Idastar<Tiles>::dfs(Idastar<Tiles> *this,State *n,int cost,int pop)

{
  size_t *psVar1;
  pointer *ppSVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  Tiles *pTVar6;
  iterator __position;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  iVar9 = n->h + cost;
  if (this->bound < iVar9) {
    if (this->minoob < 0 || iVar9 < this->minoob) {
      this->minoob = iVar9;
    }
  }
  else {
    if (n->h == '\0') {
LAB_00106690:
      __position._M_current =
           (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Tiles::State,std::allocator<Tiles::State>>::
        _M_realloc_insert<Tiles::State_const&>
                  ((vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path,__position,n);
      }
      else {
        cVar3 = n->h;
        (__position._M_current)->blank = n->blank;
        (__position._M_current)->h = cVar3;
        uVar7 = *(undefined8 *)(n->tiles + 8);
        *(undefined8 *)(__position._M_current)->tiles = *(undefined8 *)n->tiles;
        *(undefined8 *)((__position._M_current)->tiles + 8) = uVar7;
        ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
      return true;
    }
    psVar1 = &(this->super_SearchAlg<Tiles>).expd;
    *psVar1 = *psVar1 + 1;
    cVar3 = n->blank;
    lVar10 = (long)cVar3;
    lVar11 = (long)*(int *)((this->super_SearchAlg<Tiles>).dom + lVar10 * 0x14 + 0x4440);
    if (0 < lVar11) {
      lVar12 = lVar10 * 0x14;
      do {
        pTVar6 = (this->super_SearchAlg<Tiles>).dom;
        iVar9 = *(int *)(pTVar6 + lVar12 + 0x4444);
        if (iVar9 != pop) {
          psVar1 = &(this->super_SearchAlg<Tiles>).gend;
          *psVar1 = *psVar1 + 1;
          cVar4 = n->h;
          cVar5 = n->tiles[iVar9];
          n->tiles[lVar10] = cVar5;
          n->h = n->h + (char)pTVar6[(long)n->blank * 4 +
                                     (long)cVar5 * 0x400 + (long)iVar9 * 0x40 + 0x440];
          n->blank = (char)iVar9;
          bVar8 = dfs(this,n,cost + 1,(int)cVar3);
          n->h = cVar4;
          n->tiles[n->blank] = n->tiles[lVar10];
          n->blank = cVar3;
          if (bVar8) goto LAB_00106690;
        }
        lVar12 = lVar12 + 4;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  return false;
}

Assistant:

bool dfs(typename D::State &n,  int cost, int pop) {
		int f = cost + this->dom.h(n);

		if (f <= bound && this->dom.isgoal(n)) {
			path.push_back(n);
			return true;
		}

		if (f > bound) {
			if (minoob < 0 || f < minoob)
				minoob = f;
			return false;
		}

		this->expd++;
		int nops = this->dom.nops(n);
		for (int i = 0; i < nops; i++) {
			int op = this->dom.nthop(n, i);
			if (op == pop)
				continue;

			this->gend++;
			Edge<D> e = this->dom.apply(n, op);
			bool goal = dfs(n, e.cost + cost, e.pop);
			this->dom.undo(n, e);
			if (goal) {
				path.push_back(n);
				return true;
			}
		}

		return false;
	}